

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3auxGrowStatArray(Fts3auxCursor *pCsr,int nSize)

{
  int iVar1;
  Fts3auxColstats *pFVar2;
  int iVar3;
  
  iVar3 = 0;
  if (pCsr->nStat < nSize) {
    pFVar2 = pCsr->aStat;
    iVar1 = sqlite3_initialize();
    iVar3 = 7;
    if (iVar1 == 0) {
      pFVar2 = (Fts3auxColstats *)sqlite3Realloc(pFVar2,(long)nSize << 4);
      if (pFVar2 != (Fts3auxColstats *)0x0) {
        iVar3 = 0;
        memset(pFVar2 + pCsr->nStat,0,((long)nSize - (long)pCsr->nStat) * 0x10);
        pCsr->aStat = pFVar2;
        pCsr->nStat = nSize;
      }
    }
  }
  return iVar3;
}

Assistant:

static int fts3auxGrowStatArray(Fts3auxCursor *pCsr, int nSize){
  if( nSize>pCsr->nStat ){
    struct Fts3auxColstats *aNew;
    aNew = (struct Fts3auxColstats *)sqlite3_realloc64(pCsr->aStat, 
        sizeof(struct Fts3auxColstats) * nSize
    );
    if( aNew==0 ) return SQLITE_NOMEM;
    memset(&aNew[pCsr->nStat], 0, 
        sizeof(struct Fts3auxColstats) * (nSize - pCsr->nStat)
    );
    pCsr->aStat = aNew;
    pCsr->nStat = nSize;
  }
  return SQLITE_OK;
}